

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::Store<unsigned_int>(Memory *this,u64 offset,u64 addend,uint val)

{
  bool bVar1;
  
  bVar1 = IsValidAccess(this,offset,addend,4);
  if (bVar1) {
    *(uint *)((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start + addend + offset) = val;
  }
  return (Result)(uint)!bVar1;
}

Assistant:

Result WABT_VECTORCALL Memory::Store(u64 offset, u64 addend, T val) {
  if (!IsValidAccess(offset, addend, sizeof(T))) {
    return Result::Error;
  }
  MemcpyEndianAware(data_.data(), &val, data_.size(), sizeof(T),
                    offset + addend, 0, sizeof(T));
  return Result::Ok;
}